

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall Session::MainPoint(Session *this)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  string command;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,'\x14');
  if (this->m_Opened == true) {
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x60);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_50,cVar1);
      bVar2 = Handler::RunCommand(&this->m_Handler,&local_50);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Command: ",9);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," doesn\'t exists",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    } while (this->m_Opened != false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Session::MainPoint() {
    std::string command(20, '\0');
    while (IsOpened()) {
        std::getline(std::cin, command);
        if(!m_Handler.RunCommand(command)) {
            std::cout << "Command: " << command << " doesn't exists" << std::endl;
        }
    }
}